

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

void p_bracket(parse *p)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  size_t sVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  uch uVar8;
  int iVar9;
  cset *pcVar10;
  ushort **ppuVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uch *puVar15;
  int iVar16;
  char **ppcVar17;
  byte bVar18;
  sop op;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  char *pcVar22;
  re_guts *prVar23;
  byte *__s1;
  char *pcVar24;
  ulong uVar25;
  cset *pcVar26;
  cset *cs;
  bool bVar27;
  int iStack_50;
  
  prVar23 = p->g;
  uVar21 = prVar23->ncsets;
  prVar23->ncsets = uVar21 + 1;
  iVar9 = prVar23->csetsize;
  uVar12 = p->ncsalloc;
  if ((int)uVar21 < (int)uVar12) {
    pcVar10 = prVar23->sets;
LAB_00104862:
    if (pcVar10 == (cset *)0x0) {
      __assert_fail("p->g->sets != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x495,"cset *allocset()");
    }
  }
  else {
    iVar16 = (int)((long)(int)uVar12 + 8);
    p->ncsalloc = iVar16;
    if ((uVar12 & 7) != 0) {
      __assert_fail("nc % CHAR_BIT == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x47b,"cset *allocset()");
    }
    iVar16 = (iVar16 >> 3) * iVar9;
    sVar20 = ((long)(int)uVar12 + 8) * 0x20;
    if (prVar23->sets == (cset *)0x0) {
      pcVar10 = (cset *)malloc(sVar20);
    }
    else {
      pcVar10 = (cset *)realloc(prVar23->sets,sVar20);
      prVar23 = p->g;
    }
    prVar23->sets = pcVar10;
    if (prVar23->setbits == (uch *)0x0) {
      puVar15 = (uch *)malloc((long)iVar16);
      prVar23->setbits = puVar15;
    }
    else {
      puVar15 = (uch *)realloc(prVar23->setbits,(long)iVar16);
      prVar23 = p->g;
      prVar23->setbits = puVar15;
      uVar12 = 0;
      uVar25 = 0;
      if (0 < (int)uVar21) {
        uVar25 = (ulong)uVar21;
      }
      for (lVar13 = 0; uVar25 * 0x20 != lVar13; lVar13 = lVar13 + 0x20) {
        *(uch **)((long)&prVar23->sets->ptr + lVar13) = puVar15 + (ulong)(uVar12 >> 3) * (long)iVar9
        ;
        uVar12 = uVar12 + 1;
      }
    }
    pcVar10 = prVar23->sets;
    if ((puVar15 == (uch *)0x0) || (pcVar10 == (cset *)0x0)) {
      if (p->error == 0) {
        p->error = 0xc;
      }
      p->next = nuls;
      p->end = nuls;
      uVar21 = 0;
      goto LAB_00104862;
    }
    memset(puVar15 + (iVar16 - iVar9),0,(long)iVar9);
  }
  puVar15 = prVar23->setbits + ((int)uVar21 / 8) * iVar9;
  pcVar10[(int)uVar21].ptr = puVar15;
  bVar18 = (byte)(1 << ((byte)uVar21 & 7));
  pcVar10[(int)uVar21].mask = bVar18;
  pcVar10[(int)uVar21].hash = '\0';
  pcVar10[(int)uVar21].smultis = 0;
  (&pcVar10[(int)uVar21].smultis)[1] = 0;
  __s1 = (byte *)p->next;
  pbVar3 = (byte *)p->end;
  if (__s1 + 5 < pbVar3) {
    iVar9 = strncmp((char *)__s1,"[:<:]]",6);
    if (iVar9 == 0) {
      op = 0x4c000000;
LAB_00104dce:
      doemit(p,op,0);
      p->next = p->next + 6;
      return;
    }
    iVar9 = strncmp((char *)__s1,"[:>:]]",6);
    if (iVar9 == 0) {
      op = 0x50000000;
      goto LAB_00104dce;
    }
  }
  if ((__s1 < pbVar3) && (*__s1 == 0x5e)) {
    __s1 = __s1 + 1;
    p->next = (char *)__s1;
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  cs = pcVar10 + (int)uVar21;
  if (__s1 < pbVar3) {
    bVar2 = *__s1;
    uVar25 = (ulong)bVar2;
    if (bVar2 != 0x5d) {
      if (bVar2 != 0x2d) goto LAB_00104946;
      uVar25 = 0x2d;
    }
    p->next = (char *)(__s1 + 1);
    puVar15[uVar25] = puVar15[uVar25] | bVar18;
    cs->hash = cs->hash + bVar2;
  }
LAB_00104946:
LAB_00104955:
  pcVar24 = p->next;
  pcVar22 = p->end;
  if ((pcVar22 <= pcVar24) || (cVar7 = *pcVar24, cVar7 == ']')) goto LAB_00104d2a;
  pcVar1 = pcVar24 + 1;
  if (cVar7 == '-' && pcVar1 < pcVar22) goto code_r0x00104988;
  if (cVar7 == '-') goto LAB_00104a5a;
  if ((cVar7 != '[') || (pcVar22 <= pcVar1)) {
LAB_00104a73:
    cVar6 = p_b_symbol(p);
    pcVar24 = p->next;
    cVar7 = cVar6;
    if (((pcVar24 < p->end) && (*pcVar24 == '-')) &&
       ((pcVar22 = pcVar24 + 1, pcVar22 < p->end && (*pcVar22 != ']')))) {
      p->next = pcVar22;
      if (*pcVar22 == '-') {
        p->next = pcVar24 + 2;
        cVar7 = '-';
      }
      else {
        cVar7 = p_b_symbol(p);
      }
      if (cVar7 < cVar6) {
        if (p->error == 0) {
          p->error = 0xb;
        }
        p->next = nuls;
        p->end = nuls;
      }
    }
    for (lVar13 = (long)cVar6; lVar13 <= cVar7; lVar13 = lVar13 + 1) {
      cs->ptr[lVar13] = cs->ptr[lVar13] | cs->mask;
      cs->hash = cs->hash + (char)lVar13;
    }
    goto LAB_00104955;
  }
  if (*pcVar1 != '=') {
    if (*pcVar1 != ':') goto LAB_00104a73;
    pcVar24 = pcVar24 + 2;
    p->next = pcVar24;
    if (pcVar22 <= pcVar24) {
      if (p->error == 0) {
        p->error = 7;
      }
      p->next = nuls;
      p->end = nuls;
      pcVar22 = nuls;
      pcVar24 = nuls;
    }
    if ((*pcVar24 == ']') || (*pcVar24 == '-')) {
      if (p->error == 0) {
        p->error = 4;
      }
      p->next = nuls;
      p->end = nuls;
      pcVar22 = nuls;
      pcVar24 = nuls;
    }
    sVar20 = 0;
    while ((pcVar24 + sVar20 < pcVar22 &&
           (ppuVar11 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar11 + (long)pcVar24[sVar20] * 2 + 1) & 4) != 0))) {
      p->next = pcVar24 + sVar20 + 1;
      sVar20 = sVar20 + 1;
    }
    ppcVar17 = &cclasses[0].multis;
LAB_00104aed:
    pcVar22 = ((cclass *)(ppcVar17 + -2))->name;
    if (pcVar22 != (char *)0x0) {
      iVar9 = strncmp(pcVar22,pcVar24,sVar20);
      if ((iVar9 != 0) || (pcVar22[sVar20] != '\0')) goto LAB_00104b18;
      pcVar24 = ppcVar17[-1];
      while( true ) {
        cVar7 = *pcVar24;
        if ((long)cVar7 == 0) break;
        cs->ptr[cVar7] = cs->ptr[cVar7] | cs->mask;
        pcVar24 = pcVar24 + 1;
        cs->hash = cs->hash + cVar7;
      }
      for (pcVar24 = *ppcVar17; *pcVar24 != '\0'; pcVar24 = pcVar24 + sVar20 + 1) {
        sVar4 = cs->smultis;
        sVar20 = strlen(pcVar24);
        sVar20 = sVar20 + sVar4 + 1;
        cs->smultis = sVar20;
        if (cs->multis == (char *)0x0) {
          pcVar22 = (char *)malloc(sVar20);
        }
        else {
          pcVar22 = (char *)realloc(cs->multis,sVar20);
        }
        cs->multis = pcVar22;
        if (pcVar22 == (char *)0x0) {
          if (p->error == 0) {
            p->error = 0xc;
          }
          p->next = nuls;
          p->end = nuls;
        }
        else {
          strcpy(pcVar22 + (sVar4 - 1),pcVar24);
          pcVar22[pcVar10[(int)uVar21].smultis - 1] = '\0';
        }
        sVar20 = strlen(pcVar24);
      }
      pcVar24 = p->next;
      if (p->end <= pcVar24) goto LAB_00104cea;
      if (((pcVar24 + 1 < p->end) && (*pcVar24 == ':')) && (pcVar24[1] == ']')) goto LAB_00104cde;
      bVar27 = p->error == 0;
      iStack_50 = 4;
      goto LAB_00104cf0;
    }
    iStack_50 = 4;
    if (p->error == 0) goto LAB_00104cf7;
    goto LAB_00104a67;
  }
  pcVar24 = pcVar24 + 2;
  p->next = pcVar24;
  if (pcVar22 <= pcVar24) {
    if (p->error == 0) {
      p->error = 7;
    }
    p->next = nuls;
    p->end = nuls;
    pcVar24 = nuls;
  }
  if ((*pcVar24 == ']') || (*pcVar24 == '-')) {
    if (p->error == 0) {
      p->error = 3;
    }
    p->next = nuls;
    p->end = nuls;
  }
  cVar7 = p_b_coll_elem(p,0x3d);
  cs->ptr[cVar7] = cs->ptr[cVar7] | cs->mask;
  cs->hash = cs->hash + cVar7;
  pcVar24 = p->next;
  if (pcVar24 < p->end) {
    if (((pcVar24 + 1 < p->end) && (*pcVar24 == '=')) && (pcVar24[1] == ']')) {
LAB_00104cde:
      p->next = pcVar24 + 2;
      goto LAB_00104955;
    }
    bVar27 = p->error == 0;
    iStack_50 = 3;
  }
  else {
LAB_00104cea:
    bVar27 = p->error == 0;
    iStack_50 = 7;
  }
LAB_00104cf0:
  if (bVar27) {
LAB_00104cf7:
    p->error = iStack_50;
  }
LAB_00104a67:
  p->next = nuls;
  p->end = nuls;
  goto LAB_00104955;
LAB_00104b18:
  ppcVar17 = ppcVar17 + 3;
  goto LAB_00104aed;
code_r0x00104988:
  if (*pcVar1 == ']') {
    p->next = pcVar1;
    cs->ptr[0x2d] = cs->ptr[0x2d] | cs->mask;
    cs->hash = cs->hash + '-';
    pcVar24 = p->next;
    pcVar22 = p->end;
LAB_00104d2a:
    if (pcVar24 < pcVar22) {
      p->next = pcVar24 + 1;
      iVar9 = p->error;
      if (*pcVar24 == ']') {
        if (iVar9 != 0) {
          return;
        }
        if ((p->g->cflags & 2) != 0) {
          uVar25 = (ulong)(uint)p->g->csetsize;
          while (0 < (int)uVar25) {
            uVar25 = uVar25 - 1;
            if ((cs->ptr[uVar25 & 0xff] & cs->mask) != 0) {
              ppuVar11 = __ctype_b_loc();
              if (((*(byte *)((long)*ppuVar11 + (uVar25 & 0xffffffff) * 2 + 1) & 4) != 0) &&
                 (cVar7 = othercase((int)uVar25), (int)uVar25 != (int)cVar7)) {
                cs->ptr[cVar7] = cs->ptr[cVar7] | cs->mask;
                cs->hash = cs->hash + cVar7;
              }
            }
          }
          if (cs->multis != (char *)0x0) {
            __assert_fail("cs->multis == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x282,"void p_bracket()");
          }
        }
        if (bVar5) {
          if (cs->multis != (char *)0x0) {
            __assert_fail("cs->multis == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x299,"void p_bracket()");
          }
        }
        else {
          uVar25 = (ulong)(uint)p->g->csetsize;
          while (0 < (int)uVar25) {
            uVar14 = uVar25 - 1;
            puVar15 = cs->ptr;
            bVar18 = cs->mask;
            if ((puVar15[uVar14 & 0xff] & bVar18) == 0) {
              puVar15[uVar14 & 0xffffffff] = puVar15[uVar14 & 0xffffffff] | bVar18;
              uVar8 = (char)uVar25 + cs->hash + 0xff;
            }
            else {
              puVar15[uVar14 & 0xffffffff] = puVar15[uVar14 & 0xffffffff] & ~bVar18;
              uVar8 = cs->hash - (char)uVar14;
            }
            cs->hash = uVar8;
            uVar25 = uVar14;
          }
          if ((p->g->cflags & 8) != 0) {
            cs->ptr[10] = cs->ptr[10] & ~cs->mask;
            cs->hash = cs->hash + 0xf6;
          }
          if (cs->multis != (char *)0x0) {
            __assert_fail("cs->multis == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x292,"void p_bracket()");
          }
        }
        prVar23 = p->g;
        uVar25 = (ulong)prVar23->csetsize;
        iVar9 = 0;
        for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
          iVar9 = (iVar9 + 1) - (uint)((cs->mask & cs->ptr[uVar14 & 0xff]) == 0);
        }
        if (iVar9 == 1) {
          iVar9 = 0;
          uVar14 = 0;
          while( true ) {
            if (uVar25 == uVar14) {
              __assert_fail("never",
                            "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                            ,0x4e7,"int firstch()");
            }
            if ((cs->ptr[uVar14 & 0xff] & cs->mask) != 0) break;
            uVar14 = uVar14 + 1;
            iVar9 = iVar9 + 0x1000000;
          }
          ordinary(p,iVar9 >> 0x18);
          freeset(p,cs);
          return;
        }
        pcVar10 = prVar23->sets;
        pcVar26 = pcVar10;
        do {
          if (pcVar10 + prVar23->ncsets <= pcVar26) {
LAB_00104f89:
            doemit(p,0x18000000,(long)(int)((ulong)((long)cs - (long)pcVar10) >> 5));
            return;
          }
          if ((pcVar26 != cs) && (pcVar26->hash == cs->hash)) {
            uVar14 = 0;
            do {
              if (uVar25 == uVar14) {
                freeset(p,cs);
                pcVar10 = p->g->sets;
                cs = pcVar26;
                goto LAB_00104f89;
              }
              uVar19 = uVar14 & 0xff;
              uVar14 = uVar14 + 1;
            } while (((cs->ptr[uVar19] & cs->mask) == 0) !=
                     ((pcVar26->ptr[uVar19] & pcVar26->mask) != 0));
          }
          pcVar26 = pcVar26 + 1;
        } while( true );
      }
    }
    else {
      iVar9 = p->error;
    }
    if (iVar9 == 0) {
      p->error = 7;
    }
    p->next = nuls;
    p->end = nuls;
    return;
  }
LAB_00104a5a:
  if (p->error == 0) {
    p->error = 0xb;
  }
  goto LAB_00104a67;
}

Assistant:

static void
p_bracket(p)
struct parse *p;
{
	cset *cs = allocset(p);
	int invert = 0;

	/* Dept of Truly Sickening Special-Case Kludges */
	if (p->next + 5 < p->end && strncmp(p->next, "[:<:]]", 6) == 0) {
		EMIT(OBOW, 0);
		NEXTn(6);
		return;
	}
	if (p->next + 5 < p->end && strncmp(p->next, "[:>:]]", 6) == 0) {
		EMIT(OEOW, 0);
		NEXTn(6);
		return;
	}

	if (EAT('^'))
		invert++;	/* make note to invert set at end */
	if (EAT(']'))
		CHadd(cs, ']');
	else if (EAT('-'))
		CHadd(cs, '-');
	while (MORE() && PEEK() != ']' && !SEETWO('-', ']'))
		p_b_term(p, cs);
	if (EAT('-'))
		CHadd(cs, '-');
	MUSTEAT(']', REG_EBRACK);

	if (p->error != 0)	/* don't mess things up further */
		return;

	if (p->g->cflags&REG_ICASE) {
		int i;
		int ci;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i) && isalpha(i)) {
				ci = othercase(i);
				if (ci != i)
					CHadd(cs, ci);
			}
		assert(cs->multis == NULL);	/* xxx */
#if 0		
		if (cs->multis != NULL)
			mccase(p, cs);
#endif
	}
	if (invert) {
		int i;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i))
				CHsub(cs, i);
			else
				CHadd(cs, i);
		if (p->g->cflags&REG_NEWLINE)
			CHsub(cs, '\n');
		assert(cs->multis == NULL);	/* xxx */
#if 0
		if (cs->multis != NULL)
			mcinvert(p, cs);
#endif
	}

	assert(cs->multis == NULL);		/* xxx */

	if (nch(p, cs) == 1) {		/* optimize singleton sets */
		ordinary(p, firstch(p, cs));
		freeset(p, cs);
	} else
		EMIT(OANYOF, freezeset(p, cs));
}